

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  double dVar3;
  int iVar4;
  wchar_t wVar5;
  ImGuiWindow *pIVar6;
  ImGuiTableTempData *pIVar7;
  ImGuiWindow *pIVar8;
  float *__src;
  ImGuiTableColumn *pIVar9;
  float fVar10;
  uint uVar11;
  ImGuiContext_conflict1 *pIVar12;
  bool bVar13;
  wchar_t wVar14;
  uint uVar15;
  uint uVar16;
  ImU32 IVar17;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiTableTempData *pIVar18;
  ImDrawListSplitter *pIVar19;
  float *__dest;
  ImGuiTableColumn *pIVar20;
  char *pcVar21;
  ImGuiTableColumn *pIVar22;
  char *__dest_00;
  long lVar23;
  ImRect *pIVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  size_t size;
  wchar_t wVar29;
  long lVar30;
  ImVec2 *pIVar31;
  ImGuiTableColumnFlags *pIVar32;
  ImVec2 *pIVar33;
  ImGuiID id_00;
  int iVar34;
  wchar_t wVar35;
  ulong uVar36;
  byte bVar37;
  float fVar38;
  undefined4 in_XMM0_Db;
  ImVec2 IVar39;
  ImVec2 IVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ImGuiContext_conflict *g;
  ImRect outer_rect;
  void *local_108;
  ImRect local_f8;
  float *local_e8;
  ImGuiTableTempData *local_e0;
  undefined8 local_d8;
  char *local_c8;
  ulong local_c0;
  ulong local_b8;
  ImVec2 *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar12 = GImGui;
  bVar37 = 0;
  local_d8 = (ImGuiWindow *)CONCAT44(in_XMM0_Db,inner_width);
  pIVar6 = (ImGuiWindow *)GImGui->CurrentWindow;
  pIVar6->WriteAccessed = true;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  uVar25 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x13e,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x140,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar39 = GetContentRegionAvail();
  fVar41 = IVar39.x;
  fVar43 = IVar39.y;
  if (fVar41 <= 1.0) {
    fVar41 = 1.0;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar39 = CalcItemSize(*outer_size,fVar41,0.0);
    local_f8.Min = (pIVar6->DC).CursorPos;
    local_f8.Max.y = IVar39.y + (pIVar6->DC).CursorPos.y;
    local_f8.Max.x = (pIVar6->DC).CursorPos.x + IVar39.x;
  }
  else {
    if (fVar43 <= 1.0) {
      fVar43 = 1.0;
    }
    IVar39 = CalcItemSize(*outer_size,fVar41,fVar43);
    local_f8.Min = (pIVar6->DC).CursorPos;
    local_f8.Max.y = IVar39.y + (pIVar6->DC).CursorPos.y;
    local_f8.Max.x = (pIVar6->DC).CursorPos.x + IVar39.x;
    bVar13 = IsClippedEx(&local_f8,0);
    if (bVar13) {
      ItemSize(&local_f8,-1.0);
      return false;
    }
  }
  local_c8 = name;
  local_b8 = (ulong)id;
  local_b0 = outer_size;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar12->Tables,id);
  local_c0 = 0;
  if (p_00->LastFrameActive == pIVar12->FrameCount) {
    local_c0 = (ulong)((int)p_00->InstanceCurrent + 1);
  }
  local_e8 = (float *)CONCAT44(local_e8._4_4_,p_00->Flags);
  if ((0 < (int)local_c0) && (p_00->ColumnsCount != columns_count)) {
    __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x153,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  wVar14 = ImPool<ImGuiTable>::GetIndex(&pIVar12->Tables,p_00);
  iVar28 = pIVar12->CurrentTableStackIdx;
  pIVar12->CurrentTableStackIdx = iVar28 + 1;
  iVar27 = iVar28 + 2;
  if ((pIVar12->TablesTempDataStack).Size < iVar27) {
    uStack_a0 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6d = 0;
    local_98._Channels.Data = (ImDrawChannel *)0x0;
    uStack_80 = 0;
    uStack_7d = 0;
    local_98._Current = 0;
    local_98._Count = 0;
    local_98._Channels.Size = 0;
    local_98._Channels.Capacity = 0;
    local_a8.x = 0.0;
    local_a8.y = -1.0;
    iVar4 = (pIVar12->TablesTempDataStack).Capacity;
    if (iVar4 < iVar27) {
      if (iVar4 == 0) {
        iVar34 = 8;
      }
      else {
        iVar34 = iVar4 / 2 + iVar4;
      }
      if (iVar34 <= iVar27) {
        iVar34 = iVar27;
      }
      if (iVar4 < iVar34) {
        pIVar18 = (ImGuiTableTempData *)MemAlloc((long)iVar34 * 0x70);
        pIVar7 = (pIVar12->TablesTempDataStack).Data;
        if (pIVar7 != (ImGuiTableTempData *)0x0) {
          local_e0 = pIVar18;
          memcpy(pIVar18,pIVar7,(long)(pIVar12->TablesTempDataStack).Size * 0x70);
          MemFree((pIVar12->TablesTempDataStack).Data);
          pIVar18 = local_e0;
        }
        (pIVar12->TablesTempDataStack).Data = pIVar18;
        (pIVar12->TablesTempDataStack).Capacity = iVar34;
      }
    }
    iVar4 = (pIVar12->TablesTempDataStack).Size;
    if (iVar4 < iVar27) {
      lVar30 = ((long)iVar28 - (long)iVar4) + 2;
      lVar26 = (long)iVar4 * 0x70;
      do {
        pIVar31 = &local_a8;
        pIVar33 = (ImVec2 *)((long)&((pIVar12->TablesTempDataStack).Data)->TableIndex + lVar26);
        for (lVar23 = 0xe; lVar23 != 0; lVar23 = lVar23 + -1) {
          *pIVar33 = *pIVar31;
          pIVar31 = pIVar31 + (ulong)bVar37 * -2 + 1;
          pIVar33 = pIVar33 + (ulong)bVar37 * -2 + 1;
        }
        lVar26 = lVar26 + 0x70;
        lVar30 = lVar30 + -1;
      } while (lVar30 != 0);
    }
    (pIVar12->TablesTempDataStack).Size = iVar27;
    ImDrawListSplitter::ClearFreeMemory(&local_98);
    if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_98._Channels.Data);
    }
  }
  lVar26 = (long)pIVar12->CurrentTableStackIdx;
  if ((lVar26 < 0) || ((pIVar12->TablesTempDataStack).Size <= pIVar12->CurrentTableStackIdx)) {
    pcVar21 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
  }
  else {
    pIVar18 = (pIVar12->TablesTempDataStack).Data;
    pIVar7 = pIVar18 + lVar26;
    p_00->TempData = pIVar7;
    pIVar18 = pIVar18 + lVar26;
    pIVar19 = &pIVar18->DrawSplitter;
    pIVar18->TableIndex = wVar14;
    p_00->DrawSplitter = pIVar19;
    pIVar19->_Current = 0;
    pIVar19->_Count = 1;
    bVar13 = (flags & 0xe000U) == 0;
    p_00->IsDefaultSizingPolicy = bVar13;
    uVar15 = flags;
    if (bVar13) {
      uVar15 = 0x2000;
      if ((((uint)flags >> 0x18 & 1) == 0) && (uVar15 = 0x2000, (pIVar6->Flags & 0x40) == 0)) {
        uVar15 = 0x8000;
      }
      uVar15 = uVar15 | flags;
    }
    uVar16 = uVar15 | 0x40000;
    if ((uVar15 & 0xe000) != 0x4000) {
      uVar16 = uVar15;
    }
    uVar15 = uVar16 & 0xfffcffff;
    if ((uVar16 & 0x3000000) == 0) {
      uVar15 = uVar16;
    }
    uVar11 = uVar15 & 0xfffff7ff;
    if ((uVar15 >> 0xc & 1) == 0) {
      uVar11 = uVar15;
    }
    uVar15 = (uVar16 & 1) << 9 | uVar11;
    uVar16 = uVar15 | 0x10;
    if ((uVar11 & 0xf) == 0) {
      uVar15 = uVar16;
    }
    id_00 = (int)local_c0 + (ImGuiID)local_b8;
    if (((uint)pIVar6->RootWindow->Flags >> 8 & 1) != 0) {
      uVar15 = uVar16;
    }
    p_00->ID = (ImGuiID)local_b8;
    p_00->Flags = uVar15;
    p_00->InstanceCurrent = (ImS16)local_c0;
    p_00->LastFrameActive = pIVar12->FrameCount;
    p_00->InnerWindow = pIVar6;
    p_00->OuterWindow = pIVar6;
    p_00->ColumnsCount = columns_count;
    p_00->IsLayoutLocked = false;
    p_00->InnerWidth = (float)local_d8;
    pIVar7->UserOuterSize = *local_b0;
    if ((flags & 0x3000000U) == 0) {
      (p_00->InnerRect).Min = local_f8.Min;
      (p_00->InnerRect).Max = local_f8.Max;
      (p_00->OuterRect).Min = local_f8.Min;
      (p_00->OuterRect).Max = local_f8.Max;
      (p_00->WorkRect).Min = local_f8.Min;
      (p_00->WorkRect).Max = local_f8.Max;
    }
    else {
      fVar41 = (float)local_d8;
      if ((uVar15 & 0x1000000) == 0) {
        fVar41 = 3.4028235e+38;
      }
      fVar41 = (float)(~-(uint)(0.0 < (float)local_d8) & 0x7f7fffff |
                      (uint)fVar41 & -(uint)(0.0 < (float)local_d8));
      if (fVar41 != 3.4028235e+38 || (uVar15 & 0x3000000) == 0x1000000) {
        if ((uVar15 & 0x3000000) == 0x1000000) {
          local_a8.y = 1.1754944e-38;
        }
        else {
          local_a8.y = 0.0;
        }
        local_a8.x = (float)(-(uint)(fVar41 != 3.4028235e+38) & (uint)fVar41);
        SetNextWindowContentSize(&local_a8);
      }
      if (((ulong)local_e8 & 0x3000000) == 0) {
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        SetNextWindowScroll(&local_a8);
      }
      local_a8.x = local_f8.Max.x - local_f8.Min.x;
      local_a8.y = local_f8.Max.y - local_f8.Min.y;
      BeginChildEx(local_c8,id_00,&local_a8,false,(uVar15 & 0x1000000) >> 0xd);
      pIVar8 = (ImGuiWindow *)pIVar12->CurrentWindow;
      p_00->InnerWindow = pIVar8;
      IVar39 = (pIVar8->WorkRect).Max;
      (p_00->WorkRect).Min = (pIVar8->WorkRect).Min;
      (p_00->WorkRect).Max = IVar39;
      fVar41 = (pIVar8->Pos).x;
      fVar43 = (pIVar8->Pos).y;
      fVar38 = (pIVar8->Size).x;
      fVar42 = (pIVar8->Size).y;
      fVar10 = (pIVar8->Pos).y;
      (p_00->OuterRect).Min.x = (pIVar8->Pos).x;
      (p_00->OuterRect).Min.y = fVar10;
      (p_00->OuterRect).Max.x = fVar41 + fVar38;
      (p_00->OuterRect).Max.y = fVar43 + fVar42;
      IVar39 = (pIVar8->InnerRect).Max;
      (p_00->InnerRect).Min = (pIVar8->InnerRect).Min;
      (p_00->InnerRect).Max = IVar39;
      if (((((pIVar8->WindowPadding).x != 0.0) ||
           (fVar41 = (pIVar8->WindowPadding).y, fVar41 != 0.0)) || (NAN(fVar41))) ||
         ((pIVar8->WindowBorderSize != 0.0 || (NAN(pIVar8->WindowBorderSize))))) {
        __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                      ,0x18c,
                      "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                     );
      }
    }
    PushOverrideID(id_00);
    pIVar8 = p_00->InnerWindow;
    p_00->HostIndentX = (pIVar8->DC).Indent.x;
    IVar39 = (pIVar8->ClipRect).Max;
    (p_00->HostClipRect).Min = (pIVar8->ClipRect).Min;
    (p_00->HostClipRect).Max = IVar39;
    p_00->HostSkipItems = pIVar8->SkipItems;
    IVar39 = (pIVar8->WorkRect).Max;
    (pIVar7->HostBackupWorkRect).Min = (pIVar8->WorkRect).Min;
    (pIVar7->HostBackupWorkRect).Max = IVar39;
    IVar39 = (pIVar8->ParentWorkRect).Max;
    (pIVar7->HostBackupParentWorkRect).Min = (pIVar8->ParentWorkRect).Min;
    (pIVar7->HostBackupParentWorkRect).Max = IVar39;
    (pIVar7->HostBackupColumnsOffset).x = (pIVar6->DC).ColumnsOffset.x;
    pIVar7->HostBackupPrevLineSize = (pIVar8->DC).PrevLineSize;
    pIVar7->HostBackupCurrLineSize = (pIVar8->DC).CurrLineSize;
    pIVar7->HostBackupCursorMaxPos = (pIVar8->DC).CursorMaxPos;
    pIVar7->HostBackupItemWidth = (pIVar6->DC).ItemWidth;
    pIVar7->HostBackupItemWidthStackSize = (pIVar6->DC).ItemWidthStack.Size;
    fVar41 = 0.0;
    fVar43 = 0.0;
    if ((uVar15 >> 9 & 1) != 0) {
      fVar43 = 1.0;
    }
    (pIVar8->DC).CurrLineSize.x = 0.0;
    (pIVar8->DC).CurrLineSize.y = 0.0;
    (pIVar8->DC).PrevLineSize.x = 0.0;
    (pIVar8->DC).PrevLineSize.y = 0.0;
    if ((uVar15 & 0x800200) == 0) {
      fVar41 = (pIVar12->Style).CellPadding.x;
    }
    fVar42 = 0.0;
    fVar38 = 0.0;
    if ((uVar15 & 0x800200) == 0x200) {
      fVar38 = (pIVar12->Style).CellPadding.x;
    }
    p_00->CellSpacingX1 = fVar43 + fVar41;
    p_00->CellSpacingX2 = fVar41;
    p_00->CellPaddingX = fVar38;
    p_00->CellPaddingY = (pIVar12->Style).CellPadding.y;
    fVar41 = 0.0;
    if ((uVar15 >> 10 & 1) != 0) {
      fVar41 = 1.0;
    }
    if ((uVar15 >> 0x16 & 1) == 0 && (uVar15 & 0x200400) != 0) {
      fVar42 = (pIVar12->Style).CellPadding.x;
    }
    p_00->OuterPaddingX = (fVar41 + fVar42) - fVar38;
    p_00->CurrentRow = -1;
    p_00->CurrentColumn = -1;
    p_00->RowBgColorCounter = 0;
    *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
    pIVar24 = &pIVar8->ClipRect;
    if (pIVar8 == pIVar6) {
      pIVar24 = &p_00->WorkRect;
    }
    IVar39 = pIVar24->Max;
    (p_00->InnerClipRect).Min = pIVar24->Min;
    (p_00->InnerClipRect).Max = IVar39;
    fVar41 = (p_00->InnerClipRect).Min.x;
    fVar43 = (p_00->InnerClipRect).Min.y;
    fVar38 = (p_00->WorkRect).Min.x;
    fVar42 = (p_00->WorkRect).Min.y;
    uVar16 = -(uint)(fVar38 <= fVar41);
    IVar39.x = (float)(~uVar16 & (uint)fVar38 | (uint)fVar41 & uVar16);
    uVar16 = -(uint)(fVar42 <= fVar43);
    IVar39.y = (float)(~uVar16 & (uint)fVar42 | (uint)fVar43 & uVar16);
    (p_00->InnerClipRect).Min = IVar39;
    fVar43 = (p_00->InnerClipRect).Max.x;
    fVar41 = (p_00->WorkRect).Max.x;
    if (fVar41 <= fVar43) {
      fVar43 = fVar41;
    }
    fVar41 = (p_00->InnerClipRect).Max.y;
    fVar38 = (p_00->WorkRect).Max.y;
    if (fVar38 <= fVar41) {
      fVar41 = fVar38;
    }
    IVar40.y = fVar41;
    IVar40.x = fVar43;
    (p_00->InnerClipRect).Max = IVar40;
    ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
    if ((uVar15 >> 0x11 & 1) == 0) {
      fVar41 = (pIVar8->ClipRect).Max.y;
    }
    else {
      fVar41 = (p_00->InnerClipRect).Max.y;
      fVar43 = (pIVar8->WorkRect).Max.y;
      if (fVar43 <= fVar41) {
        fVar41 = fVar43;
      }
    }
    (p_00->InnerClipRect).Max.y = fVar41;
    fVar41 = (p_00->WorkRect).Min.y;
    p_00->RowPosY2 = fVar41;
    p_00->RowPosY1 = fVar41;
    p_00->RowTextBaseline = 0.0;
    p_00->FreezeRowsRequest = '\0';
    p_00->FreezeRowsCount = '\0';
    p_00->FreezeColumnsRequest = '\0';
    p_00->FreezeColumnsCount = '\0';
    p_00->IsUnfrozenRows = true;
    p_00->DeclColumnsCount = '\0';
    IVar17 = GetColorU32(0x2d,1.0);
    p_00->BorderColorStrong = IVar17;
    IVar17 = GetColorU32(0x2e,1.0);
    p_00->BorderColorLight = IVar17;
    pIVar12->CurrentTable = p_00;
    (pIVar6->DC).CurrentTableIdx = wVar14;
    if (pIVar8 != pIVar6) {
      (pIVar8->DC).CurrentTableIdx = wVar14;
    }
    if ((((ulong)local_e8 & 2) != 0) && ((uVar15 & 2) == 0)) {
      p_00->IsResetDisplayOrderRequest = true;
    }
    local_d8 = pIVar8;
    if ((pIVar12->TablesLastTimeActive).Size <= wVar14) {
      wVar29 = wVar14 + L'\x01';
      wVar5 = (pIVar12->TablesLastTimeActive).Capacity;
      if (wVar5 <= wVar14) {
        if (wVar5 == L'\0') {
          wVar35 = L'\b';
        }
        else {
          wVar35 = wVar5 / 2 + wVar5;
        }
        if (wVar35 <= wVar29) {
          wVar35 = wVar29;
        }
        if (wVar5 < wVar35) {
          __dest = (float *)MemAlloc((long)wVar35 << 2);
          __src = (pIVar12->TablesLastTimeActive).Data;
          if (__src != (float *)0x0) {
            local_e8 = __dest;
            memcpy(__dest,__src,(long)(pIVar12->TablesLastTimeActive).Size << 2);
            MemFree((pIVar12->TablesLastTimeActive).Data);
            __dest = local_e8;
          }
          (pIVar12->TablesLastTimeActive).Data = __dest;
          (pIVar12->TablesLastTimeActive).Capacity = wVar35;
        }
      }
      wVar5 = (pIVar12->TablesLastTimeActive).Size;
      lVar26 = (long)wVar5;
      if (wVar5 <= wVar14) {
        do {
          (pIVar12->TablesLastTimeActive).Data[lVar26] = -1.0;
          lVar26 = lVar26 + 1;
        } while (wVar29 != lVar26);
      }
      (pIVar12->TablesLastTimeActive).Size = wVar29;
    }
    if ((L'\xffffffff' < wVar14) && (wVar14 < (pIVar12->TablesLastTimeActive).Size)) {
      dVar3 = pIVar12->Time;
      (pIVar12->TablesLastTimeActive).Data[(uint)wVar14] = (float)dVar3;
      pIVar7->LastTimeActive = (float)dVar3;
      p_00->MemoryCompacted = false;
      pIVar22 = (p_00->Columns).Data;
      iVar28 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar22 >> 3) * -0x3b13b13b;
      if (iVar28 == columns_count || iVar28 == 0) {
        local_108 = (void *)0x0;
        pIVar22 = (ImGuiTableColumn *)0x0;
      }
      else {
        local_108 = p_00->RawData;
        p_00->RawData = (void *)0x0;
      }
      if (p_00->RawData == (void *)0x0) {
        TableBeginInitMemory(p_00,columns_count);
        p_00->IsSettingsRequestLoad = true;
        p_00->IsInitializing = true;
      }
      if (p_00->IsResetAllRequest == true) {
        p_00->IsInitializing = true;
        p_00->IsResetAllRequest = false;
        p_00->IsSettingsRequestLoad = false;
        p_00->IsSettingsDirty = true;
        p_00->SettingsLoadedFlags = 0;
      }
      if (p_00->IsInitializing == true) {
        p_00->SettingsOffset = -1;
        p_00->IsSortSpecsDirty = true;
        p_00->InstanceInteracted = -1;
        p_00->ContextPopupColumn = -1;
        p_00->ReorderColumn = -1;
        p_00->HoveredColumnBody = -1;
        p_00->HoveredColumnBorder = -1;
        p_00->AutoFitSingleColumn = -1;
        p_00->ResizedColumn = -1;
        p_00->LastResizedColumn = -1;
        if (0 < columns_count) {
          lVar26 = 0x61;
          uVar36 = 0;
          do {
            pIVar9 = (p_00->Columns).Data;
            pIVar20 = (ImGuiTableColumn *)((long)pIVar9 + lVar26 + -0x61);
            if ((p_00->Columns).DataEnd <= pIVar20) goto LAB_001d8b62;
            if ((pIVar22 == (ImGuiTableColumn *)0x0) || ((long)iVar28 <= (long)uVar36)) {
              uVar2 = *(undefined4 *)((long)pIVar9 + lVar26 + -0x4d);
              local_78 = 0;
              local_98._Channels.Data = (ImDrawChannel *)0x0;
              uStack_80 = 0;
              uStack_7d = 0;
              local_98._Current = 0;
              local_98._Count = 0;
              local_98._Channels.Size = 0;
              local_98._Channels.Capacity = 0;
              local_a8.x = 0.0;
              local_a8.y = 0.0;
              uStack_a0 = 0;
              uStack_70 = 0xffffff;
              uStack_74 = 0xffffffff;
              pIVar20->Flags = 0;
              pIVar20->WidthGiven = 0.0;
              *(undefined8 *)((long)pIVar9 + lVar26 + -0x59) = 0;
              *(undefined8 *)((long)pIVar9 + lVar26 + -0x51) = 0xbf800000;
              *(undefined4 *)((long)pIVar9 + lVar26 + -0x49) = 0xbf800000;
              puVar1 = (undefined8 *)((long)pIVar9 + lVar26 + -0x45);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)pIVar9 + lVar26 + -0x35);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined1 (*) [16])((long)pIVar9 + lVar26 + -0x25) = ZEXT816(0) << 0x40;
              puVar1 = (undefined8 *)((long)pIVar9 + lVar26 + -0x1a);
              *puVar1 = 0;
              puVar1[1] = 0xffffffffffffff00;
              *(undefined2 *)((long)pIVar9 + lVar26 + -10) = 0xffff;
              *(undefined1 *)((long)pIVar9 + lVar26 + -8) = 0xff;
              *(undefined8 *)((long)pIVar9 + lVar26 + -7) = 0;
              *(undefined8 *)((long)pIVar9 + lVar26 + -2) = 0;
              *(undefined4 *)((long)pIVar9 + lVar26 + -0x4d) = uVar2;
              *(undefined1 *)((long)&pIVar9->Flags + lVar26) = 1;
              *(undefined1 *)((long)pIVar9 + lVar26 + -5) = 1;
              *(undefined2 *)((long)pIVar9 + lVar26 + -7) = 0x101;
            }
            else {
              pIVar32 = (ImGuiTableColumnFlags *)((long)pIVar22 + lVar26 + -0x61);
              for (lVar30 = 0x19; lVar30 != 0; lVar30 = lVar30 + -1) {
                pIVar20->Flags = *pIVar32;
                pIVar32 = pIVar32 + (ulong)bVar37 * -2 + 1;
                pIVar20 = (ImGuiTableColumn *)((long)pIVar20 + (ulong)bVar37 * -8 + 4);
              }
              *(undefined1 *)((long)&pIVar9->WidthGiven + lVar26 + 1) =
                   *(undefined1 *)((long)&pIVar22->WidthGiven + lVar26 + 1);
              *(undefined2 *)((long)&pIVar9->Flags + lVar26 + 3) =
                   *(undefined2 *)((long)&pIVar22->Flags + lVar26 + 3);
            }
            pcVar21 = (p_00->DisplayOrderToIndex).Data + uVar36;
            if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar21) {
              pcVar21 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
              goto LAB_001d8b8e;
            }
            *pcVar21 = (char)uVar36;
            *(char *)((long)pIVar9 + lVar26 + -0xf) = (char)uVar36;
            uVar36 = uVar36 + 1;
            lVar26 = lVar26 + 0x68;
          } while ((uint)columns_count != uVar36);
        }
      }
      if (local_108 != (void *)0x0) {
        MemFree(local_108);
      }
      pIVar6 = local_d8;
      if (p_00->IsSettingsRequestLoad == true) {
        TableLoadSettings(p_00);
      }
      fVar41 = pIVar12->FontSize;
      fVar43 = p_00->RefScale;
      if ((fVar43 != 0.0) || (NAN(fVar43))) {
        if (((fVar43 != fVar41) || (NAN(fVar43) || NAN(fVar41))) && (0 < columns_count)) {
          pIVar22 = (p_00->Columns).Data;
          do {
            if ((p_00->Columns).DataEnd <= pIVar22) {
LAB_001d8b62:
              pcVar21 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_001d8b8e:
              __assert_fail("p >= Data && p < DataEnd",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                            ,0x24a,pcVar21);
            }
            pIVar22->WidthRequest = pIVar22->WidthRequest * (fVar41 / fVar43);
            pIVar22 = pIVar22 + 1;
            uVar25 = uVar25 - 1;
          } while (uVar25 != 0);
        }
      }
      p_00->RefScale = fVar41;
      pIVar6->SkipItems = true;
      if (0 < (p_00->ColumnsNames).Buf.Size) {
        iVar28 = (p_00->ColumnsNames).Buf.Capacity;
        if (iVar28 < 0) {
          uVar15 = iVar28 / 2 + iVar28;
          size = 0;
          if (0 < (int)uVar15) {
            size = (size_t)uVar15;
          }
          __dest_00 = (char *)MemAlloc(size);
          pcVar21 = (p_00->ColumnsNames).Buf.Data;
          if (pcVar21 != (char *)0x0) {
            memcpy(__dest_00,pcVar21,(long)(p_00->ColumnsNames).Buf.Size);
            MemFree((p_00->ColumnsNames).Buf.Data);
          }
          (p_00->ColumnsNames).Buf.Data = __dest_00;
          (p_00->ColumnsNames).Buf.Capacity = (int)size;
        }
        (p_00->ColumnsNames).Buf.Size = 0;
      }
      TableBeginApplyRequests(p_00);
      return true;
    }
    pcVar21 = "T &ImVector<float>::operator[](int) [T = float]";
  }
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x706,pcVar21);
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStackIdx++;
    if (g.CurrentTableStackIdx + 1 > g.TablesTempDataStack.Size)
        g.TablesTempDataStack.resize(g.CurrentTableStackIdx + 1, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempDataStack[g.CurrentTableStackIdx];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}